

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serfloat_tests.cpp
# Opt level: O1

uint64_t serfloat_tests::anon_unknown_4::TestDouble(double f)

{
  assertion_result *paVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar4;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 local_170 [16];
  undefined1 *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  uint64_t i2;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  double f2;
  uint64_t i;
  double f_local;
  double *local_b0;
  assertion_result local_a8;
  double **local_90;
  double *local_88;
  lazy_ostream local_80;
  undefined1 *local_70;
  double **local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  f_local = f;
  i = EncodeDouble(f);
  f2 = DecodeDouble(i);
  if (NAN(f_local)) {
    local_d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_d0 = "";
    local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar4 = 0x6181db;
    file_02.m_end = (iterator)0x1a;
    file_02.m_begin = (iterator)&local_d8;
    msg_02.m_end = in_R9;
    msg_02.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_e8,
               msg_02);
    local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)NAN(f2);
    local_a8.m_message.px = (element_type *)0x0;
    local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_68 = (double **)local_170;
    local_170._0_8_ = "std::isnan(f2)";
    local_170._8_8_ = "";
    local_80.m_empty = false;
    local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
    local_70 = boost::unit_test::lazy_ostream::inst;
    local_f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_f0 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_a8,&local_80,1,0,WARN,_cVar4,(size_t)&local_f8,0x1a);
    paVar1 = &local_a8;
  }
  else {
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_100 = "";
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar4 = 0x617e3d;
    file.m_end = (iterator)0x1d;
    file.m_begin = (iterator)&local_108;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
    local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)!NAN(f2);
    local_a8.m_message.px = (element_type *)0x0;
    local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_68 = (double **)local_170;
    local_170._0_8_ = "!std::isnan(f2)";
    local_170._8_8_ = "";
    local_80.m_empty = false;
    local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
    local_70 = boost::unit_test::lazy_ostream::inst;
    local_128 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_120 = "";
    pvVar2 = (iterator)0x1;
    pvVar3 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_a8,&local_80,1,0,WARN,_cVar4,(size_t)&local_128,0x1d);
    boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
    i2 = EncodeDouble(f2);
    local_140 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_138 = "";
    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x1f;
    file_00.m_begin = (iterator)&local_140;
    msg_00.m_end = pvVar3;
    msg_00.m_begin = pvVar2;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_150,
               msg_00);
    local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
    local_170._0_8_ = &PTR__lazy_ostream_013d3cb0;
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_88 = &f_local;
    local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(f_local == f2);
    local_158 = "";
    local_50.m_message.px = (element_type *)0x0;
    local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_58 = "";
    local_68 = &local_88;
    local_80.m_empty = false;
    local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d5600;
    local_70 = boost::unit_test::lazy_ostream::inst;
    local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
    local_a8._0_8_ = &PTR__lazy_ostream_013d5600;
    local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pvVar2 = (iterator)0x1;
    pvVar3 = (iterator)0x2;
    local_b0 = &f2;
    local_90 = &local_b0;
    boost::test_tools::tt_detail::report_assertion
              (&local_50,(lazy_ostream *)local_170,1,2,REQUIRE,0xe8291d,(size_t)&local_60,0x1f,
               &local_80,"f2",&local_a8);
    boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
    local_180 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_178 = "";
    local_190 = &boost::unit_test::basic_cstring<char_const>::null;
    local_188 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x20;
    file_01.m_begin = (iterator)&local_180;
    msg_01.m_end = pvVar3;
    msg_01.m_begin = pvVar2;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_190,
               msg_01);
    local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
    local_170._0_8_ = &PTR__lazy_ostream_013d3cb0;
    local_88 = (double *)&i;
    local_b0 = (double *)&i2;
    local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(i == i2);
    local_160 = boost::unit_test::lazy_ostream::inst;
    local_158 = "";
    local_50.m_message.px = (element_type *)0x0;
    local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_58 = "";
    local_80.m_empty = false;
    local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cf0;
    local_70 = boost::unit_test::lazy_ostream::inst;
    local_68 = &local_88;
    local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
    local_a8._0_8_ = &PTR__lazy_ostream_013d3cf0;
    local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_90 = &local_b0;
    boost::test_tools::tt_detail::report_assertion
              (&local_50,(lazy_ostream *)local_170,1,2,REQUIRE,0xed88a7,(size_t)&local_60,0x20,
               &local_80,"i2",&local_a8);
    paVar1 = &local_50;
  }
  boost::detail::shared_count::~shared_count(&(paVar1->m_message).pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return i;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t TestDouble(double f) {
    uint64_t i = EncodeDouble(f);
    double f2 = DecodeDouble(i);
    if (std::isnan(f)) {
        // NaN is not guaranteed to round-trip exactly.
        BOOST_CHECK(std::isnan(f2));
    } else {
        // Everything else is.
        BOOST_CHECK(!std::isnan(f2));
        uint64_t i2 = EncodeDouble(f2);
        BOOST_CHECK_EQUAL(f, f2);
        BOOST_CHECK_EQUAL(i, i2);
    }
    return i;
}